

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_process_priority_update_frame(nghttp2_session *session)

{
  uint8_t *payload;
  int iVar1;
  
  payload = (session->iframe).sbuf.pos;
  nghttp2_frame_unpack_priority_update_payload
            ((nghttp2_extension *)&session->iframe,payload,
             (long)(session->iframe).sbuf.last - (long)payload);
  iVar1 = nghttp2_session_on_priority_update_received(session,&(session->iframe).frame);
  return iVar1;
}

Assistant:

static int session_process_priority_update_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  nghttp2_frame_unpack_priority_update_payload(&frame->ext, iframe->sbuf.pos,
                                               nghttp2_buf_len(&iframe->sbuf));

  return nghttp2_session_on_priority_update_received(session, frame);
}